

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_permute(ggml_context *ctx,ggml_tensor *a,int axis0,int axis1,int axis2,int axis3)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined4 extraout_EAX;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *extraout_RAX;
  undefined4 in_register_0000000c;
  int32_t value;
  int extraout_EDX;
  ggml_tensor *extraout_RDX;
  ggml_tensor *extraout_RDX_00;
  ggml_tensor *extraout_RDX_01;
  ggml_tensor *extraout_RDX_02;
  ggml_tensor *extraout_RDX_03;
  ggml_tensor *unaff_RBX;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  ulong unaff_R12;
  ggml_tensor *unaff_R14;
  int nb [4];
  int ne [4];
  int iStack_120;
  int iStack_11c;
  undefined8 uStack_118;
  ggml_tensor *pgStack_108;
  ggml_tensor *pgStack_100;
  ggml_type gStack_f8;
  int iStack_f4;
  undefined8 uStack_f0;
  ggml_tensor *pgStack_e0;
  ggml_tensor *pgStack_d8;
  undefined4 uStack_d0;
  int iStack_cc;
  ggml_tensor *pgStack_c8;
  ulong uStack_c0;
  ggml_type gStack_68;
  int iStack_64;
  ggml_tensor *pgStack_60;
  ggml_tensor *pgStack_58;
  ggml_tensor *pgStack_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  pgVar4 = (ggml_tensor *)CONCAT44(in_register_00000084,axis2);
  pgVar3 = (ggml_tensor *)CONCAT44(in_register_0000000c,axis1);
  if ((uint)axis0 < 4) {
    if (3 < (uint)axis1) goto LAB_00120e4d;
    unaff_R14 = (ggml_tensor *)(ulong)(uint)axis2;
    if (3 < (uint)axis2) goto LAB_00120e52;
    if (3 < (uint)axis3) goto LAB_00120e57;
    unaff_R12 = (ulong)(uint)axis0;
    if (axis0 == axis1) goto LAB_00120e5c;
    if (axis0 == axis2) goto LAB_00120e61;
    if (axis0 == axis3) goto LAB_00120e66;
    if (axis1 == axis2) goto LAB_00120e6b;
    if (axis1 == axis3) goto LAB_00120e70;
    if (axis2 == axis3) goto LAB_00120e75;
    unaff_RBX = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_50 = (ggml_tensor *)0x120dcb;
      pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      *(int *)((long)&local_38 + unaff_R12 * 4) = a->ne[0];
      *(int *)((long)&local_38 + (ulong)(uint)axis1 * 4) = a->ne[1];
      *(int *)((long)&local_38 + (ulong)(uint)axis2 * 4) = a->ne[2];
      *(int *)((long)&local_38 + (ulong)(uint)axis3 * 4) = a->ne[3];
      *(int *)(local_48 + unaff_R12 * 4) = (int)a->nb[0];
      *(int *)(local_48 + (ulong)(uint)axis1 * 4) = (int)a->nb[1];
      *(int *)(local_48 + (ulong)(uint)axis2 * 4) = (int)a->nb[2];
      *(int *)(local_48 + (ulong)(uint)axis3 * 4) = (int)a->nb[3];
      *(undefined8 *)pgVar3->ne = local_38;
      *(undefined8 *)(pgVar3->ne + 2) = uStack_30;
      auVar2 = vpmovsxdq_avx2(local_48);
      *(undefined1 (*) [32])pgVar3->nb = auVar2;
      pgVar3->op = GGML_OP_PERMUTE;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = a;
      pgVar3->src1 = (ggml_tensor *)0x0;
      return pgVar3;
    }
  }
  else {
    pgStack_50 = (ggml_tensor *)0x120e4d;
    ggml_permute_cold_1();
LAB_00120e4d:
    pgStack_50 = (ggml_tensor *)0x120e52;
    ggml_permute_cold_2();
LAB_00120e52:
    pgStack_50 = (ggml_tensor *)0x120e57;
    ggml_permute_cold_3();
LAB_00120e57:
    pgStack_50 = (ggml_tensor *)0x120e5c;
    ggml_permute_cold_4();
LAB_00120e5c:
    pgStack_50 = (ggml_tensor *)0x120e61;
    ggml_permute_cold_11();
LAB_00120e61:
    pgStack_50 = (ggml_tensor *)0x120e66;
    ggml_permute_cold_10();
LAB_00120e66:
    pgStack_50 = (ggml_tensor *)0x120e6b;
    ggml_permute_cold_9();
LAB_00120e6b:
    pgStack_50 = (ggml_tensor *)0x120e70;
    ggml_permute_cold_8();
LAB_00120e70:
    pgStack_50 = (ggml_tensor *)0x120e75;
    ggml_permute_cold_7();
LAB_00120e75:
    pgStack_50 = (ggml_tensor *)0x120e7a;
    ggml_permute_cold_6();
  }
  pgStack_50 = (ggml_tensor *)ggml_transpose;
  ggml_permute_cold_5();
  pgStack_50 = unaff_RBX;
  if (a->grad == (ggml_tensor *)0x0) {
    pgStack_58 = (ggml_tensor *)0x120e9f;
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3->ne[0] = a->ne[1];
    pgVar3->ne[1] = a->ne[0];
    pgVar3->nb[0] = a->nb[1];
    pgVar3->nb[1] = a->nb[0];
    pgVar3->op = GGML_OP_TRANSPOSE;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  pgStack_58 = (ggml_tensor *)ggml_get_rows;
  ggml_transpose_cold_1();
  pgVar5 = unaff_RBX;
  pgVar6 = unaff_R14;
  pgStack_60 = unaff_RBX;
  pgStack_58 = unaff_R14;
  if ((((a->ne[2] == 1) && (pgVar6 = a, a->ne[3] == 1)) &&
      (pgVar5 = extraout_RDX, extraout_RDX->ne[1] == 1)) &&
     (((extraout_RDX->ne[2] == 1 && (extraout_RDX->ne[3] == 1)) &&
      (extraout_RDX->type == GGML_TYPE_I32)))) {
    if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX->grad == (ggml_tensor *)0x0)) {
      _gStack_68 = CONCAT44(extraout_RDX->ne[0],a->ne[0]);
      pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_68,(void *)0x0);
      pgVar3->op = GGML_OP_GET_ROWS;
      pgVar3->grad = (ggml_tensor *)0x0;
      pgVar3->src0 = a;
      pgVar3->src1 = extraout_RDX;
      return pgVar3;
    }
  }
  else {
    ggml_get_rows_cold_1();
  }
  ggml_get_rows_cold_2();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar4 = ggml_new_i32(ctx,value);
    pgVar3->op = GGML_OP_DIAG_MASK_INF;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = pgVar4;
    return pgVar3;
  }
  ggml_diag_mask_inf_cold_1();
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar3->op = GGML_OP_SOFT_MAX;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_soft_max_cold_1();
  pgStack_c8 = pgVar5;
  uStack_c0 = unaff_R12;
  if (extraout_EDX < 0) {
    pgStack_d8 = (ggml_tensor *)0x1210a0;
    ggml_rope_cold_1();
    pgStack_e0 = pgVar5;
  }
  else {
    pgStack_e0 = a;
    if (a->grad == (ggml_tensor *)0x0) {
      pgStack_d8 = (ggml_tensor *)0x12103d;
      uStack_d0 = extraout_EAX;
      pgVar5 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
      _uStack_d0 = CONCAT44(3,uStack_d0);
      pgStack_d8 = (ggml_tensor *)0x121060;
      pgVar6 = ggml_new_tensor_impl(ctx,GGML_TYPE_I32,1,&iStack_cc,(void *)0x0);
      piVar1 = (int *)pgVar6->data;
      *piVar1 = extraout_EDX;
      piVar1[1] = (int)pgVar3;
      piVar1[2] = (int)pgVar4;
      pgVar5->op = GGML_OP_ROPE;
      pgVar5->grad = (ggml_tensor *)0x0;
      pgVar5->src0 = a;
      pgVar5->src1 = pgVar6;
      return pgVar5;
    }
  }
  pgStack_d8 = (ggml_tensor *)ggml_conv_1d_1s;
  ggml_rope_cold_2();
  pgVar5 = pgStack_e0;
  pgStack_d8 = pgVar6;
  if ((extraout_RDX_00->ne[2] == 1) && (pgVar5 = extraout_RDX_00, extraout_RDX_00->ne[3] == 1)) {
    pgVar6 = a;
    if (a->ne[1] != extraout_RDX_00->ne[1]) goto LAB_00121133;
    if (a->ne[3] == 1) {
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_00->grad == (ggml_tensor *)0x0)) {
        gStack_f8 = extraout_RDX_00->ne[0];
        iStack_f4 = a->ne[2];
        uStack_f0 = 0x100000001;
        pgStack_100 = (ggml_tensor *)0x12110a;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,(int *)&gStack_f8,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_1S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = extraout_RDX_00;
        return pgVar3;
      }
      goto LAB_0012112e;
    }
  }
  else {
    pgStack_100 = (ggml_tensor *)0x12112e;
    ggml_conv_1d_1s_cold_1();
LAB_0012112e:
    pgStack_100 = (ggml_tensor *)0x121133;
    ggml_conv_1d_1s_cold_4();
LAB_00121133:
    pgStack_100 = (ggml_tensor *)0x121138;
    ggml_conv_1d_1s_cold_2();
  }
  pgStack_100 = (ggml_tensor *)ggml_conv_1d_2s;
  ggml_conv_1d_1s_cold_3();
  pgStack_108 = pgVar5;
  pgStack_100 = pgVar6;
  if ((extraout_RDX_01->ne[2] == 1) && (extraout_RDX_01->ne[3] == 1)) {
    if (a->ne[1] == extraout_RDX_01->ne[1]) {
      if (a->ne[3] != 1) goto LAB_001211dd;
      if ((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_01->grad == (ggml_tensor *)0x0)) {
        iStack_120 = extraout_RDX_01->ne[0] / 2;
        iStack_11c = a->ne[2];
        uStack_118 = 0x100000001;
        pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&iStack_120,(void *)0x0);
        pgVar3->op = GGML_OP_CONV_1D_2S;
        pgVar3->grad = (ggml_tensor *)0x0;
        pgVar3->src0 = a;
        pgVar3->src1 = extraout_RDX_01;
        return pgVar3;
      }
      goto LAB_001211d3;
    }
  }
  else {
    ggml_conv_1d_2s_cold_1();
LAB_001211d3:
    ggml_conv_1d_2s_cold_4();
  }
  ggml_conv_1d_2s_cold_2();
LAB_001211dd:
  ggml_conv_1d_2s_cold_3();
  if (((extraout_RDX_02->ne[0] == a->ne[0]) && (extraout_RDX_02->ne[2] == a->ne[2])) &&
     (extraout_RDX_02->ne[3] == a->ne[3])) {
    if (((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_02->grad == (ggml_tensor *)0x0)) &&
       (pgVar3->grad == (ggml_tensor *)0x0)) {
      pgVar5 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar5->op = GGML_OP_FLASH_ATTN;
      pgVar5->grad = (ggml_tensor *)0x0;
      pgVar5->src0 = a;
      pgVar5->src1 = extraout_RDX_02;
      pgVar5->opt[0] = pgVar3;
      pgVar3 = ggml_new_i32(ctx,(uint)pgVar4 & 0xff);
      pgVar5->opt[1] = pgVar3;
      return pgVar5;
    }
  }
  else {
    ggml_flash_attn_cold_1();
  }
  ggml_flash_attn_cold_2();
  if (((extraout_RDX_03->ne[0] == a->ne[0]) && (extraout_RDX_03->ne[2] == a->ne[2])) &&
     (extraout_RDX_03->ne[3] == a->ne[3])) {
    if ((((a->grad == (ggml_tensor *)0x0) && (extraout_RDX_03->grad == (ggml_tensor *)0x0)) &&
        (pgVar3->grad == (ggml_tensor *)0x0)) &&
       ((pgVar4->grad == (ggml_tensor *)0x0 &&
        (*(long *)(CONCAT44(in_register_0000008c,axis3) + 0x40) == 0)))) {
      pgVar5 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,a->ne,(void *)0x0);
      pgVar5->op = GGML_OP_FLASH_FF;
      pgVar5->grad = (ggml_tensor *)0x0;
      pgVar5->src0 = a;
      pgVar5->src1 = extraout_RDX_03;
      pgVar5->opt[0] = pgVar3;
      pgVar5->opt[1] = pgVar4;
      pgVar5->opt[2] = (ggml_tensor *)CONCAT44(in_register_0000008c,axis3);
      return pgVar5;
    }
    ggml_flash_ff_cold_2();
  }
  ggml_flash_ff_cold_1();
  a->is_param = true;
  if (a->grad == (ggml_tensor *)0x0) {
    pgVar3 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    a->grad = pgVar3;
    return pgVar3;
  }
  ggml_set_param_cold_1();
  ggml_build_forward_impl((ggml_cgraph *)ctx,a,true);
  return extraout_RAX;
}

Assistant:

struct ggml_tensor * ggml_permute(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   axis0,
        int                   axis1,
        int                   axis2,
        int                   axis3) {
    GGML_ASSERT(axis0 >= 0 && axis0 < GGML_MAX_DIMS);
    GGML_ASSERT(axis1 >= 0 && axis1 < GGML_MAX_DIMS);
    GGML_ASSERT(axis2 >= 0 && axis2 < GGML_MAX_DIMS);
    GGML_ASSERT(axis3 >= 0 && axis3 < GGML_MAX_DIMS);

    GGML_ASSERT(axis0 != axis1);
    GGML_ASSERT(axis0 != axis2);
    GGML_ASSERT(axis0 != axis3);
    GGML_ASSERT(axis1 != axis2);
    GGML_ASSERT(axis1 != axis3);
    GGML_ASSERT(axis2 != axis3);

    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement backward
        is_node = true;
    }

    struct ggml_tensor * result = ggml_view_tensor(ctx, a);

    int ne[GGML_MAX_DIMS];
    int nb[GGML_MAX_DIMS];

    ne[axis0] = a->ne[0];
    ne[axis1] = a->ne[1];
    ne[axis2] = a->ne[2];
    ne[axis3] = a->ne[3];

    nb[axis0] = a->nb[0];
    nb[axis1] = a->nb[1];
    nb[axis2] = a->nb[2];
    nb[axis3] = a->nb[3];

    result->ne[0] = ne[0];
    result->ne[1] = ne[1];
    result->ne[2] = ne[2];
    result->ne[3] = ne[3];

    result->nb[0] = nb[0];
    result->nb[1] = nb[1];
    result->nb[2] = nb[2];
    result->nb[3] = nb[3];

    result->op   = GGML_OP_PERMUTE;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL; // TODO: maybe store the permutation here?

    return result;
}